

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>
               (void)

{
  Underlying_matrix *this;
  bool bVar1;
  undefined **local_8c0;
  undefined1 local_8b8;
  undefined8 *local_8b0;
  char **local_8a8;
  char *local_8a0;
  char *local_898;
  Index local_890 [2];
  undefined8 local_888;
  shared_count sStack_880;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  value_type boundary1;
  value_type boundary2;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
  m;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>>
            ();
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary2,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(orderedBoundaries.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary1,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(orderedBoundaries.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
              *)&m,&orderedBoundaries,5);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_entry(&m.matrix_.reducedMatrixR_,1,0);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_entry(1, 0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_8a8 = &local_8a0;
  local_890[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_entry(&m.matrix_.reducedMatrixR_,3,0);
  local_890[0]._0_1_ = !bVar1;
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_entry(3, 0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,0);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,1);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(1)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,2);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(2)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_column(&m.matrix_.reducedMatrixR_,3);
  local_890[0]._0_1_ = !bVar1;
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_column(3)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_column(&m.matrix_.reducedMatrixR_,4);
  local_890[0] = CONCAT31(local_890[0]._1_3_,!bVar1);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_column(4)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_890[0] = (Index)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_8a0._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_1b0,0x1c2,1,2,local_890,"m.get_number_of_columns()",&local_8a0,"5");
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
  ::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
              *)&m,&boundary1,-1);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x1c4);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_890[0] = (Index)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_8a0._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_1e0,0x1c4,1,2,local_890,"m.get_number_of_columns()",&local_8a0,"6");
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
  ::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>
              *)&m,&boundary2,-1);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c6);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_890[0] = (Index)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_8a0 = (char *)CONCAT44(local_8a0._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_210,0x1c6,1,2,local_890,"m.get_number_of_columns()",&local_8a0,"7");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c7);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_entry(&m.matrix_.reducedMatrixR_,1,0);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_entry(1, 0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_8a8 = &local_8a0;
  local_890[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c8);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_entry(&m.matrix_.reducedMatrixR_,3,0);
  local_890[0]._0_1_ = !bVar1;
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_entry(3, 0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1c9);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,0);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(0)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1ca);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,1);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(1)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1cb);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,2);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(2)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1cc);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_column(&m.matrix_.reducedMatrixR_,3);
  local_890[0]._0_1_ = !bVar1;
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_column(3)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1cd);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_column(&m.matrix_.reducedMatrixR_,4);
  local_890[0]._0_1_ = !bVar1;
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_column(4)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1cf);
  local_890[0]._0_1_ =
       Gudhi::persistence_matrix::
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
       ::is_zero_column(&m.matrix_.reducedMatrixR_,5);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "m.is_zero_column(5)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1d3);
  bVar1 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::is_zero_column(&m.matrix_.reducedMatrixR_,6);
  local_890[0] = CONCAT31(local_890[0]._1_3_,!bVar1);
  local_888 = 0;
  sStack_880.pi_ = (sp_counted_base *)0x0;
  local_8a0 = "!m.is_zero_column(6)";
  local_898 = "";
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001cd158;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_8a8 = &local_8a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_880);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x1d5);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_758 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,0);
  local_8a0 = (char *)((ulong)local_8a0 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_760,0x1d5,1,2,local_890,"m.get_column_dimension(0)",&local_8a0,"0");
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f0,0x1d6);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_768 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,1);
  local_8a0 = (char *)((ulong)local_8a0 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_770,0x1d6,1,2,local_890,"m.get_column_dimension(1)",&local_8a0,"0");
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x1d7);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,2);
  local_8a0 = (char *)((ulong)local_8a0 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_780,0x1d7,1,2,local_890,"m.get_column_dimension(2)",&local_8a0,"0");
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x1d8);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_788 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,3);
  local_8a0._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_790,0x1d8,1,2,local_890,"m.get_column_dimension(3)",&local_8a0,"1");
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x1d9);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_798 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,4);
  local_8a0._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_7a0,0x1d9,1,2,local_890,"m.get_column_dimension(4)",&local_8a0,"1");
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0x1da);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7a8 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,5);
  local_8a0._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_7b0,0x1da,1,2,local_890,"m.get_column_dimension(5)",&local_8a0,"1");
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x1db);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7b8 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_dimension(&m.matrix_.reducedMatrixR_,6);
  local_8a0._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8c0,&local_7c0,0x1db,1,2,local_890,"m.get_column_dimension(6)",&local_8a0,"2");
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4b0,0x1dd);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7c8 = "";
  this = &m.matrix_;
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,0);
  local_8a0._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_8c0,&local_7d0,0x1dd,1,2,local_890,"m.get_pivot(0)",&local_8a0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x1de);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7d8 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,1);
  local_8a0._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_8c0,&local_7e0,0x1de,1,2,local_890,"m.get_pivot(1)",&local_8a0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x1df);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7e8 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,2);
  local_8a0._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_8c0,&local_7f0,0x1df,1,2,local_890,"m.get_pivot(2)",&local_8a0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_510,0x1e0);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7f8 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,3);
  local_8a0._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_800,0x1e0,1,2,local_890,"m.get_pivot(3)",&local_8a0,"1");
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_530,0x1e1);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_808 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,4);
  local_8a0._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_810,0x1e1,1,2,local_890,"m.get_pivot(4)",&local_8a0,"2");
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x1e3);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_818 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,5);
  local_8a0._0_4_ = 0xffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_8c0,&local_820,0x1e3,1,2,local_890,"m.get_pivot(5)",&local_8a0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()");
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_570,0x1e7);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_828 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_pivot(this,6);
  local_8a0._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_830,0x1e7,1,2,local_890,"m.get_pivot(6)",&local_8a0,"5");
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_590,0x1ea);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_838 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_with_pivot(this,1);
  local_8a0._0_4_ = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_840,0x1ea,1,2,local_890,"m.get_column_with_pivot(1)",&local_8a0,"3");
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5b0,0x1eb);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_848 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_with_pivot(this,2);
  local_8a0._0_4_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_850,0x1eb,1,2,local_890,"m.get_column_with_pivot(2)",&local_8a0,"4");
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5c8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5d0,0x1ec);
  local_8b8 = 0;
  local_8c0 = &PTR__lazy_ostream_001ccf58;
  local_8b0 = &boost::unit_test::lazy_ostream::inst;
  local_8a8 = (char **)0x187303;
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_858 = "";
  local_890[0] = Gudhi::persistence_matrix::
                 RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::get_column_with_pivot(this,5);
  local_8a0 = (char *)CONCAT44(local_8a0._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8c0,&local_860,0x1ec,1,2,local_890,"m.get_column_with_pivot(5)",&local_8a0,"6");
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
  ::~Matrix(&m);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&boundary1.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&boundary2.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}